

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O1

void __thiscall sf::priv::ClipboardImpl::~ClipboardImpl(ClipboardImpl *this)

{
  pointer puVar1;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar2;
  
  if (this->m_window != 0) {
    XDestroyWindow(this->m_display);
    XFlush(this->m_display);
  }
  CloseDisplay(this->m_display);
  std::_Deque_base<_XEvent,_std::allocator<_XEvent>_>::~_Deque_base
            (&(this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>);
  puVar1 = (this->m_clipboardContents).m_string._M_dataplus._M_p;
  paVar2 = &(this->m_clipboardContents).m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)puVar1 != paVar2) {
    operator_delete(puVar1,paVar2->_M_allocated_capacity * 4 + 4);
    return;
  }
  return;
}

Assistant:

ClipboardImpl::~ClipboardImpl()
{
    // Destroy the window
    if (m_window)
    {
        XDestroyWindow(m_display, m_window);
        XFlush(m_display);
    }

    // Close the connection with the X server
    CloseDisplay(m_display);
}